

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

RangeValue __thiscall CoreML::RangeValue::operator*(RangeValue *this,RangeValue *other)

{
  undefined8 extraout_RAX;
  undefined8 uVar1;
  size_t sVar2;
  undefined8 extraout_RAX_00;
  RangeValue RVar3;
  RangeValue retval;
  RangeValue local_30;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (other->_isUnbound == true) {
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_20._isUnbound);
  }
  else {
    sVar2 = value(other);
    RangeValue(&local_30);
    if (this->_isUnbound == false) {
      local_30._val = sVar2 * this->_val;
      local_30._isUnbound = false;
    }
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_30._isUnbound);
    local_20._val = local_30._val;
  }
  RVar3._val = local_20._val;
  RVar3._0_8_ = uVar1;
  return RVar3;
}

Assistant:

RangeValue RangeValue::operator* (const RangeValue& other) const {
    RangeValue retval;
    if (other.isUnbound())
        return retval;
    else {
        return (*this)*other.value();
    }
}